

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

Type * __thiscall
SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
          (SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict *ppSVar4;
  SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  bVar2 = Empty(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x137,"(!Empty())","!Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&this->super_SListNodeBase<Memory::ArenaAllocator>);
  return (Type *)(*ppSVar4 + 1);
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }